

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

bool GenericModelPrivate::isVariantLessThan(QVariant *left,QVariant *right)

{
  double dVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte extraout_var;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  QString local_48;
  QArrayData *local_30 [3];
  
  iVar5 = ::QVariant::typeId(left);
  if (iVar5 == 0) {
    return false;
  }
  iVar5 = ::QVariant::typeId(right);
  if (iVar5 == 0) {
    return true;
  }
  iVar5 = ::QVariant::typeId(left);
  switch(iVar5) {
  case 2:
    iVar5 = ::QVariant::toInt((bool *)left);
    iVar6 = ::QVariant::toInt((bool *)right);
    goto LAB_0012da41;
  case 3:
    uVar7 = ::QVariant::toUInt((bool *)left);
    uVar8 = ::QVariant::toUInt((bool *)right);
    bVar2 = uVar7 < uVar8;
    break;
  case 4:
    lVar9 = ::QVariant::toLongLong((bool *)left);
    lVar10 = ::QVariant::toLongLong((bool *)right);
    goto LAB_0012dae2;
  case 5:
    uVar11 = ::QVariant::toULongLong((bool *)left);
    uVar12 = ::QVariant::toULongLong((bool *)right);
    bVar2 = uVar11 < uVar12;
    break;
  case 6:
    dVar1 = (double)::QVariant::toDouble((bool *)left);
    dVar17 = (double)::QVariant::toDouble((bool *)right);
    bVar13 = dVar17 == dVar1;
    bVar14 = dVar17 < dVar1;
    goto LAB_0012dac6;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
switchD_0012d933_caseD_7:
    ::QVariant::toString();
    ::QVariant::toString();
    QString::compare(&local_48,(CaseSensitivity)local_30);
    if (local_30[0] != (QArrayData *)0x0) {
      LOCK();
      (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30[0],2,8);
      }
    }
    bVar2 = extraout_var >> 7;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    break;
  case 0xe:
    lVar9 = ::QVariant::toDate();
    lVar10 = ::QVariant::toDate();
LAB_0012dae2:
    bVar14 = SBORROW8(lVar9,lVar10);
    bVar13 = lVar9 - lVar10 < 0;
    goto LAB_0012dae5;
  case 0xf:
    iVar5 = ::QVariant::toTime();
    iVar6 = ::QVariant::toTime();
LAB_0012da41:
    bVar14 = SBORROW4(iVar5,iVar6);
    bVar13 = iVar5 - iVar6 < 0;
LAB_0012dae5:
    bVar2 = bVar14 != bVar13;
    break;
  case 0x10:
    ::QVariant::toDateTime();
    ::QVariant::toDateTime();
    bVar2 = QDateTime::precedes((QDateTime *)&local_48);
    QDateTime::~QDateTime((QDateTime *)local_30);
    QDateTime::~QDateTime((QDateTime *)&local_48);
    break;
  default:
    if (iVar5 == 0x22) {
      uVar3 = ::QVariant::toChar();
      uVar4 = ::QVariant::toChar();
      return uVar3 < uVar4;
    }
    if (iVar5 != 0x26) goto switchD_0012d933_caseD_7;
    fVar15 = (float)::QVariant::toFloat((bool *)left);
    fVar16 = (float)::QVariant::toFloat((bool *)right);
    bVar13 = fVar16 == fVar15;
    bVar14 = fVar16 < fVar15;
LAB_0012dac6:
    bVar2 = !bVar14 && !bVar13;
  }
  return (bool)bVar2;
}

Assistant:

bool GenericModelPrivate::isVariantLessThan(const QVariant &left, const QVariant &right)
{
    if (left.userType() == QMetaType::UnknownType)
        return false;
    if (right.userType() == QMetaType::UnknownType)
        return true;
    switch (left.userType()) {
    case QMetaType::Int:
        return left.toInt() < right.toInt();
    case QMetaType::UInt:
        return left.toUInt() < right.toUInt();
    case QMetaType::LongLong:
        return left.toLongLong() < right.toLongLong();
    case QMetaType::ULongLong:
        return left.toULongLong() < right.toULongLong();
    case QMetaType::Float:
        return left.toFloat() < right.toFloat();
    case QMetaType::Double:
        return left.toDouble() < right.toDouble();
    case QMetaType::Char:
        return left.toChar() < right.toChar();
    case QMetaType::QDate:
        return left.toDate() < right.toDate();
    case QMetaType::QTime:
        return left.toTime() < right.toTime();
    case QMetaType::QDateTime:
        return left.toDateTime() < right.toDateTime();
    case QMetaType::QString:
    default:
        return left.toString().compare(right.toString()) < 0;
    }
}